

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBreak(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  Id IVar2;
  FunctionCreationContext *pFVar3;
  pointer ppEVar4;
  bool bVar5;
  uint32_t uVar6;
  value_type *ppEVar7;
  undefined8 uVar8;
  Expression *pEVar9;
  ulong uVar10;
  uintptr_t uVar11;
  int iVar12;
  long lVar13;
  TranslateToFuzzReader *this_00;
  Expression *unaff_R13;
  bool bVar14;
  Expression EVar15;
  Expression *local_60;
  Expression *local_58;
  undefined8 local_50;
  TranslateToFuzzReader *local_48;
  TranslateToFuzzReader *local_40;
  Type local_38;
  
  pFVar3 = this->funcContext;
  if ((pFVar3->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pFVar3->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0013ea0e:
    unaff_R13 = makeTrivial(this,type);
  }
  else {
    local_38.id = type.id;
    if (type.id == 1) {
      local_58 = (Expression *)0x0;
    }
    else {
      local_60 = (Expression *)0x0;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pFVar3->hangStack,
                 &local_60);
      local_58 = makeCondition(this);
    }
    iVar12 = (this->fuzzParams->super_FuzzParams).TRIES;
    local_48 = (TranslateToFuzzReader *)&this->random;
    local_40 = this;
    do {
      if (iVar12 < 1) {
        type.id = local_38.id;
        if (local_38.id != 1) {
          pppEVar1 = &(this->funcContext->hangStack).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + -1;
        }
        goto LAB_0013ea0e;
      }
      this_00 = local_48;
      ppEVar7 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Random *)local_48,&this->funcContext->breakableStack);
      pEVar9 = *ppEVar7;
      EVar15 = (Expression)getTargetName(this_00,pEVar9);
      uVar8 = EVar15._0_8_;
      IVar2 = pEVar9->_id;
      if (IVar2 != BlockId) {
        uVar11 = 0;
      }
      else {
        uVar11 = (pEVar9->type).id;
      }
      if (IVar2 != BlockId && IVar2 != LoopId) {
        wasm::handle_unreachable
                  ("unexpected expr type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x15f4);
      }
      bVar5 = true;
      if (local_38.id < 2) {
        if ((local_38.id & 1) == 0) {
          if (uVar11 == 0) {
            unaff_R13 = (Expression *)
                        MixedArena::allocSpace(&((local_40->builder).wasm)->allocator,0x30,8);
            unaff_R13->_id = BreakId;
            (unaff_R13->type).id = 0;
            *(undefined8 *)(unaff_R13 + 1) = 0;
            unaff_R13[1].type.id = 0;
            *(undefined8 *)(unaff_R13 + 2) = 0;
            (unaff_R13->type).id = 1;
            unaff_R13[1] = EVar15;
            *(undefined8 *)(unaff_R13 + 2) = 0;
            goto LAB_0013e932;
          }
        }
        else if (uVar11 == 0) {
          ppEVar4 = (this->funcContext->hangStack).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar10 = (ulong)((long)(this->funcContext->hangStack).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4) >> 3 &
                   0xffffffff;
          lVar13 = 0;
          do {
            if ((int)uVar10 < 1) break;
            pEVar9 = ppEVar4[uVar10 - 1];
            if (pEVar9 == (Expression *)0x0) {
              lVar13 = lVar13 + 1;
              bVar14 = true;
            }
            else {
              if (pEVar9->_id != LoopId) {
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                              ,0x31b,"T *wasm::Expression::cast() [T = wasm::Loop]");
              }
              bVar14 = pEVar9[1].type.id != EVar15.type.id.id;
            }
            uVar10 = uVar10 - 1;
          } while (bVar14);
          local_50 = uVar8;
          if (lVar13 == 1) {
            uVar6 = Random::upTo((Random *)local_48,2);
joined_r0x0013e97d:
            if (uVar6 != 0) goto LAB_0013e955;
          }
          else {
            if (lVar13 == 0) {
              uVar6 = Random::upTo((Random *)local_48,4);
              goto joined_r0x0013e97d;
            }
            uVar6 = Random::upTo((Random *)local_48,(int)lVar13 + 1);
            if (uVar6 == 0) goto LAB_0013e955;
          }
          uVar8 = local_50;
          unaff_R13 = (Expression *)
                      MixedArena::allocSpace(&((local_40->builder).wasm)->allocator,0x30,8);
          this = local_40;
          unaff_R13->_id = BreakId;
          (unaff_R13->type).id = 0;
          *(undefined8 *)(unaff_R13 + 1) = 0;
          unaff_R13[1].type.id = 0;
          *(undefined8 *)(unaff_R13 + 2) = 0;
          unaff_R13[2].type.id = 0;
          (unaff_R13->type).id = 1;
          *(undefined8 *)(unaff_R13 + 1) = uVar8;
          unaff_R13[1].type.id = EVar15.type.id.id;
          *(undefined8 *)(unaff_R13 + 2) = 0;
          unaff_R13[2].type.id = 0;
          wasm::Break::finalize();
          goto LAB_0013e952;
        }
      }
      else {
        if (uVar11 != local_38.id) goto LAB_0013e955;
        pEVar9 = make(local_40,local_38);
        unaff_R13 = (Expression *)
                    MixedArena::allocSpace(&((local_40->builder).wasm)->allocator,0x30,8);
        unaff_R13->_id = BreakId;
        (unaff_R13->type).id = 0;
        *(undefined8 *)(unaff_R13 + 1) = 0;
        unaff_R13[1].type.id = 0;
        *(undefined8 *)(unaff_R13 + 2) = 0;
        (unaff_R13->type).id = 1;
        unaff_R13[1] = EVar15;
        *(Expression **)(unaff_R13 + 2) = pEVar9;
LAB_0013e932:
        this = local_40;
        unaff_R13[2].type.id = (uintptr_t)local_58;
        wasm::Break::finalize();
        pppEVar1 = &(this->funcContext->hangStack).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + -1;
LAB_0013e952:
        bVar5 = false;
      }
LAB_0013e955:
      iVar12 = iVar12 + -1;
    } while (bVar5);
  }
  return unaff_R13;
}

Assistant:

Expression* TranslateToFuzzReader::makeBreak(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  Expression* condition = nullptr;
  if (type != Type::unreachable) {
    funcContext->hangStack.push_back(nullptr);
    condition = makeCondition();
  }
  // we need to find a proper target to break to; try a few times
  int tries = fuzzParams->TRIES;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto valueType = getTargetType(target);
    if (type.isConcrete()) {
      // we are flowing out a value
      if (valueType != type) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, make(type), condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else if (type == Type::none) {
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, nullptr, condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else {
      assert(type == Type::unreachable);
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      // we are about to make an *un*conditional break. if it is
      // to a loop, we prefer there to be a condition along the
      // way, to reduce the chance of infinite looping
      size_t conditions = 0;
      int i = funcContext->hangStack.size();
      while (--i >= 0) {
        auto* item = funcContext->hangStack[i];
        if (item == nullptr) {
          conditions++;
        } else if (auto* loop = item->cast<Loop>()) {
          if (loop->name == name) {
            // we found the target, no more conditions matter
            break;
          }
        }
      }
      switch (conditions) {
        case 0: {
          if (!oneIn(4)) {
            continue;
          }
          break;
        }
        case 1: {
          if (!oneIn(2)) {
            continue;
          }
          break;
        }
        default: {
          if (oneIn(conditions + 1)) {
            continue;
          }
        }
      }
      return builder.makeBreak(name);
    }
  }
  // we failed to find something
  if (type != Type::unreachable) {
    funcContext->hangStack.pop_back();
  }
  return makeTrivial(type);
}